

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

int av1_get_q_for_deltaq_objective
              (AV1_COMP *cpi,ThreadData *td,int64_t *delta_dist,BLOCK_SIZE bsize,int mi_row,
              int mi_col)

{
  byte right_shift;
  byte bVar1;
  byte bVar2;
  int iVar3;
  TplDepFrame *pTVar4;
  TplDepStats *pTVar5;
  long lVar6;
  long lVar7;
  int16_t iVar8;
  int16_t iVar9;
  int iVar10;
  undefined7 in_register_00000009;
  int iVar11;
  int qindex;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int col;
  int mi_col_00;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  uVar14 = (ulong)cpi->gf_frame_index;
  qindex = (cpi->common).quant_params.base_qindex;
  if (uVar14 < 0x60) {
    pTVar4 = (cpi->ppi->tpl_data).tpl_frame;
    if (pTVar4[uVar14].is_valid != '\0') {
      right_shift = (cpi->ppi->tpl_data).tpl_stats_block_mis_log2;
      uVar13 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
      bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar13];
      pTVar5 = pTVar4[uVar14].tpl_stats_ptr;
      iVar15 = pTVar4[uVar14].stride;
      bVar2 = (cpi->common).superres_scale_denominator;
      iVar11 = (cpi->common).superres_upscaled_width;
      iVar12 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar13] + mi_row;
      dVar24 = 0.0;
      dVar25 = 0.0;
      dVar23 = 1.0;
      dVar20 = 0.0;
      dVar22 = 0.0;
      dVar21 = 0.0;
      dVar26 = 0.0;
      for (; mi_col_00 = (int)((uint)bVar2 * mi_col + 4) / 8, mi_row < iVar12;
          mi_row = mi_row + (1 << (right_shift & 0x1f))) {
        for (; mi_col_00 < (int)(((uint)bVar1 + mi_col) * (uint)bVar2 + 4) / 8;
            mi_col_00 = mi_col_00 + (int)(((uint)bVar2 << (right_shift & 0x1f)) + 4) / 8) {
          if ((mi_row < (cpi->common).mi_params.mi_rows) &&
             (mi_col_00 < (int)(iVar11 + 7 >> 2 & 0xfffffffeU))) {
            iVar10 = av1_tpl_ptr_pos(mi_row,mi_col_00,iVar15,right_shift);
            dVar16 = (double)pTVar5[iVar10].srcrf_dist;
            iVar3 = pTVar4[uVar14].base_rdmult;
            lVar6 = pTVar5[iVar10].mc_dep_rate;
            lVar7 = pTVar5[iVar10].mc_dep_dist;
            dVar17 = (double)(pTVar5[iVar10].recrf_dist << 7);
            dVar18 = log(dVar17);
            dVar26 = dVar26 + dVar18 * dVar16;
            dVar19 = (double)(lVar7 * 0x80 + (iVar3 * lVar6 + 0x100 >> 9));
            dVar18 = log(dVar17 + dVar19);
            dVar17 = log(dVar17 * 3.0 + dVar19);
            dVar24 = dVar24 + dVar16 * dVar17;
            dVar25 = dVar25 + dVar16 * dVar18;
            dVar21 = dVar21 + (double)(pTVar5[iVar10].srcrf_dist << 7);
            dVar22 = dVar22 + (double)(pTVar5[iVar10].srcrf_sse << 7);
            dVar20 = dVar20 + (double)(pTVar5[iVar10].srcrf_rate << 4);
            dVar23 = dVar23 + dVar16;
          }
        }
      }
      if ((0.0 < dVar25) && (0.0 < dVar26)) {
        dVar16 = (cpi->rd).r0;
        dVar25 = exp((dVar26 - dVar25) / dVar23);
        dVar26 = exp((dVar26 - dVar24) / dVar23);
        (td->mb).rb = dVar26;
        iVar12 = av1_get_deltaq_offset(((cpi->common).seq_params)->bit_depth,qindex,dVar16 / dVar25)
        ;
        iVar15 = (cpi->common).delta_q_info.delta_q_res;
        iVar11 = iVar15 * 9 + -1;
        if (iVar12 < iVar11) {
          iVar11 = iVar12;
        }
        iVar15 = iVar15 * -9 + 1;
        if (iVar15 < iVar11) {
          iVar15 = iVar11;
        }
        iVar11 = (cpi->common).quant_params.base_qindex + iVar15;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        iVar8 = av1_dc_quant_QTX(qindex,0,((cpi->common).seq_params)->bit_depth);
        iVar9 = av1_dc_quant_QTX(qindex,iVar15,((cpi->common).seq_params)->bit_depth);
        qindex = iVar11;
        if (delta_dist != (int64_t *)0x0) {
          dVar26 = (double)(int)iVar9 / (double)(int)iVar8;
          dVar26 = dVar26 * dVar26 * dVar21;
          if (dVar22 <= dVar26) {
            dVar26 = dVar22;
          }
          *delta_dist = ((long)(((double)(int)iVar8 / (double)(int)iVar9) * dVar20 - dVar20) *
                         (long)pTVar4[uVar14].base_rdmult + 0x100 >> 9) +
                        (long)((dVar26 - dVar21) / dVar25) + (long)pTVar4[uVar14].base_rdmult * 2;
        }
      }
    }
  }
  return qindex;
}

Assistant:

int av1_get_q_for_deltaq_objective(AV1_COMP *const cpi, ThreadData *td,
                                   int64_t *delta_dist, BLOCK_SIZE bsize,
                                   int mi_row, int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  double intra_cost = 0;
  double mc_dep_reg = 0;
  double mc_dep_cost = 0;
  double cbcmp_base = 1;
  double srcrf_dist = 0;
  double srcrf_sse = 0;
  double srcrf_rate = 0;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];
  const int base_qindex = cm->quant_params.base_qindex;

  if (tpl_idx >= MAX_TPL_FRAME_IDX) return base_qindex;

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;
  if (!tpl_frame->is_valid) return base_qindex;

#ifndef NDEBUG
  int mi_count = 0;
#endif
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int step = 1 << block_mis_log2;
  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) continue;
      TplDepStats *this_stats =
          &tpl_stats[av1_tpl_ptr_pos(row, col, tpl_stride, block_mis_log2)];
      double cbcmp = (double)this_stats->srcrf_dist;
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      intra_cost += log(dist_scaled) * cbcmp;
      mc_dep_cost += log(dist_scaled + mc_dep_delta) * cbcmp;
      mc_dep_reg += log(3 * dist_scaled + mc_dep_delta) * cbcmp;
      srcrf_dist += (double)(this_stats->srcrf_dist << RDDIV_BITS);
      srcrf_sse += (double)(this_stats->srcrf_sse << RDDIV_BITS);
      srcrf_rate += (double)(this_stats->srcrf_rate << TPL_DEP_COST_SCALE_LOG2);
#ifndef NDEBUG
      mi_count++;
#endif
      cbcmp_base += cbcmp;
    }
  }
  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);

  int offset = 0;
  double beta = 1.0;
  double rk;
  if (mc_dep_cost > 0 && intra_cost > 0) {
    const double r0 = cpi->rd.r0;
    rk = exp((intra_cost - mc_dep_cost) / cbcmp_base);
    td->mb.rb = exp((intra_cost - mc_dep_reg) / cbcmp_base);
    beta = (r0 / rk);
    assert(beta > 0.0);
  } else {
    return base_qindex;
  }
  offset = av1_get_deltaq_offset(cm->seq_params->bit_depth, base_qindex, beta);

  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  offset = AOMMIN(offset, delta_q_info->delta_q_res * 9 - 1);
  offset = AOMMAX(offset, -delta_q_info->delta_q_res * 9 + 1);
  int qindex = cm->quant_params.base_qindex + offset;
  qindex = AOMMIN(qindex, MAXQ);
  qindex = AOMMAX(qindex, MINQ);

  int frm_qstep = av1_dc_quant_QTX(base_qindex, 0, cm->seq_params->bit_depth);
  int sbs_qstep =
      av1_dc_quant_QTX(base_qindex, offset, cm->seq_params->bit_depth);

  if (delta_dist) {
    double sbs_dist = srcrf_dist * pow((double)sbs_qstep / frm_qstep, 2.0);
    double sbs_rate = srcrf_rate * ((double)frm_qstep / sbs_qstep);
    sbs_dist = AOMMIN(sbs_dist, srcrf_sse);
    *delta_dist = (int64_t)((sbs_dist - srcrf_dist) / rk);
    *delta_dist += RDCOST(tpl_frame->base_rdmult, 4 * 256, 0);
    *delta_dist += RDCOST(tpl_frame->base_rdmult, sbs_rate - srcrf_rate, 0);
  }
  return qindex;
}